

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

MemRefOpnd * IR::MemRefOpnd::New(intptr_t pMemLoc,IRType type,Func *func,AddrOpndKind addrOpndKind)

{
  JitArenaAllocator *pJVar1;
  MemRefOpnd *this;
  TrackAllocData local_58;
  MemRefOpnd *memRefOpnd;
  Func *pFStack_20;
  AddrOpndKind addrOpndKind_local;
  Func *func_local;
  intptr_t iStack_10;
  IRType type_local;
  intptr_t pMemLoc_local;
  
  pJVar1 = func->m_alloc;
  memRefOpnd._7_1_ = addrOpndKind;
  pFStack_20 = func;
  func_local._7_1_ = type;
  iStack_10 = pMemLoc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
             ,0xb30);
  pJVar1 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar1,&local_58);
  this = (MemRefOpnd *)new<Memory::JitArenaAllocator>(0x20,pJVar1,0x4e98c0);
  memset(this,0,0x20);
  MemRefOpnd(this);
  this->m_memLoc = iStack_10;
  (this->super_Opnd).m_type = func_local._7_1_;
  (this->super_Opnd).m_kind = OpndKindMemRef;
  this->m_addrKind = memRefOpnd._7_1_;
  return this;
}

Assistant:

MemRefOpnd *
MemRefOpnd::New(intptr_t pMemLoc, IRType type, Func *func, AddrOpndKind addrOpndKind)
{
    MemRefOpnd * memRefOpnd = JitAnew(func->m_alloc, IR::MemRefOpnd);
    memRefOpnd->m_memLoc = pMemLoc;
    memRefOpnd->m_type = type;

    memRefOpnd->m_kind = OpndKindMemRef;
#if DBG_DUMP
    memRefOpnd->m_addrKind = addrOpndKind;
#endif

    return memRefOpnd;
}